

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  float fVar6;
  undefined4 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ulong uVar30;
  AABBNodeMB4D *node1;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  NodeRef *pNVar37;
  ulong uVar38;
  size_t sVar39;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 local_a98 [16];
  long local_a80;
  undefined1 (*local_a78) [16];
  long local_a70;
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  pNVar37 = stack + 1;
  stack[0] = root;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar81 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar89 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar91 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar27 = fVar2 * 0.99999964;
  fVar28 = fVar3 * 0.99999964;
  fVar29 = fVar4 * 0.99999964;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar5 = (tray->tnear).field_0.i[k];
  auVar105 = ZEXT1664(CONCAT412(iVar5,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))));
  iVar5 = (tray->tfar).field_0.i[k];
  auVar106 = ZEXT1664(CONCAT412(iVar5,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))));
  local_a78 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  bVar42 = true;
  do {
    sVar39 = pNVar37[-1].ptr;
    pNVar37 = pNVar37 + -1;
    while( true ) {
      auVar44 = auVar81._0_16_;
      auVar102 = auVar105._0_16_;
      auVar82 = auVar89._0_16_;
      auVar68 = auVar91._0_16_;
      auVar64 = auVar106._0_16_;
      if ((sVar39 & 8) != 0) break;
      uVar31 = sVar39 & 0xfffffffffffffff0;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar43._4_4_ = uVar1;
      auVar43._0_4_ = uVar1;
      auVar43._8_4_ = uVar1;
      auVar43._12_4_ = uVar1;
      auVar73 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar38),auVar43,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + uVar38));
      auVar73 = vsubps_avx(auVar73,auVar44);
      auVar49._0_4_ = fVar27 * auVar73._0_4_;
      auVar49._4_4_ = fVar27 * auVar73._4_4_;
      auVar49._8_4_ = fVar27 * auVar73._8_4_;
      auVar49._12_4_ = fVar27 * auVar73._12_4_;
      auVar102 = vmaxps_avx(auVar102,auVar49);
      auVar73 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar34),auVar43,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + uVar34));
      auVar73 = vsubps_avx(auVar73,auVar82);
      auVar56._0_4_ = fVar28 * auVar73._0_4_;
      auVar56._4_4_ = fVar28 * auVar73._4_4_;
      auVar56._8_4_ = fVar28 * auVar73._8_4_;
      auVar56._12_4_ = fVar28 * auVar73._12_4_;
      auVar73 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + uVar40),auVar43,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + uVar40));
      auVar73 = vsubps_avx(auVar73,auVar68);
      auVar63._0_4_ = fVar29 * auVar73._0_4_;
      auVar63._4_4_ = fVar29 * auVar73._4_4_;
      auVar63._8_4_ = fVar29 * auVar73._8_4_;
      auVar63._12_4_ = fVar29 * auVar73._12_4_;
      auVar73 = vmaxps_avx(auVar56,auVar63);
      auVar102 = vmaxps_avx(auVar102,auVar73);
      auVar73 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + (uVar38 ^ 0x10)),auVar43,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + (uVar38 ^ 0x10)));
      auVar44 = vsubps_avx(auVar73,auVar44);
      auVar57._0_4_ = fVar2 * auVar44._0_4_;
      auVar57._4_4_ = fVar2 * auVar44._4_4_;
      auVar57._8_4_ = fVar2 * auVar44._8_4_;
      auVar57._12_4_ = fVar2 * auVar44._12_4_;
      auVar73 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + (uVar34 ^ 0x10)),auVar43,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + (uVar34 ^ 0x10)));
      auVar44 = vminps_avx(auVar64,auVar57);
      auVar82 = vsubps_avx(auVar73,auVar82);
      auVar64._0_4_ = fVar3 * auVar82._0_4_;
      auVar64._4_4_ = fVar3 * auVar82._4_4_;
      auVar64._8_4_ = fVar3 * auVar82._8_4_;
      auVar64._12_4_ = fVar3 * auVar82._12_4_;
      auVar82 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x80 + (uVar40 ^ 0x10)),auVar43,
                                *(undefined1 (*) [16])(uVar31 + 0x20 + (uVar40 ^ 0x10)));
      auVar82 = vsubps_avx(auVar82,auVar68);
      auVar68._0_4_ = fVar4 * auVar82._0_4_;
      auVar68._4_4_ = fVar4 * auVar82._4_4_;
      auVar68._8_4_ = fVar4 * auVar82._8_4_;
      auVar68._12_4_ = fVar4 * auVar82._12_4_;
      auVar82 = vminps_avx(auVar64,auVar68);
      auVar44 = vminps_avx(auVar44,auVar82);
      if (((uint)sVar39 & 7) == 6) {
        auVar82 = vcmpps_avx(auVar102,auVar44,2);
        auVar44 = vcmpps_avx(*(undefined1 (*) [16])(uVar31 + 0xe0),auVar43,2);
        auVar68 = vcmpps_avx(auVar43,*(undefined1 (*) [16])(uVar31 + 0xf0),1);
        auVar44 = vandps_avx(auVar44,auVar68);
        auVar44 = vandps_avx(auVar44,auVar82);
      }
      else {
        auVar44 = vcmpps_avx(auVar102,auVar44,2);
      }
      auVar44 = vpslld_avx(auVar44,0x1f);
      uVar32 = vmovmskps_avx(auVar44);
      if (uVar32 == 0) goto LAB_005057ab;
      uVar32 = uVar32 & 0xff;
      lVar33 = 0;
      for (uVar35 = (ulong)uVar32; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
        lVar33 = lVar33 + 1;
      }
      sVar39 = *(size_t *)(uVar31 + lVar33 * 8);
      uVar32 = uVar32 - 1 & uVar32;
      uVar35 = (ulong)uVar32;
      if (uVar32 != 0) {
        pNVar37->ptr = sVar39;
        lVar33 = 0;
        for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
          lVar33 = lVar33 + 1;
        }
        uVar32 = uVar32 - 1 & uVar32;
        uVar35 = (ulong)uVar32;
        bVar41 = uVar32 == 0;
        while( true ) {
          pNVar37 = pNVar37 + 1;
          sVar39 = *(size_t *)(uVar31 + lVar33 * 8);
          if (bVar41) break;
          pNVar37->ptr = sVar39;
          lVar33 = 0;
          for (uVar30 = uVar35; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
            lVar33 = lVar33 + 1;
          }
          uVar35 = uVar35 - 1 & uVar35;
          bVar41 = uVar35 == 0;
        }
      }
    }
    local_a70 = (ulong)((uint)sVar39 & 0xf) - 8;
    if (local_a70 != 0) {
      uVar31 = sVar39 & 0xfffffffffffffff0;
      local_a80 = 0;
      do {
        lVar33 = local_a80 * 0x140;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar69._4_4_ = uVar1;
        auVar69._0_4_ = uVar1;
        auVar69._8_4_ = uVar1;
        auVar69._12_4_ = uVar1;
        auVar73 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x90 + lVar33),auVar69,
                                  *(undefined1 (*) [16])(uVar31 + lVar33));
        auVar84 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xa0 + lVar33),auVar69,
                                  *(undefined1 (*) [16])(uVar31 + 0x10 + lVar33));
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xb0 + lVar33),auVar69,
                                  *(undefined1 (*) [16])(uVar31 + 0x20 + lVar33));
        auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xc0 + lVar33),auVar69,
                                  *(undefined1 (*) [16])(uVar31 + 0x30 + lVar33));
        auVar75 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xd0 + lVar33),auVar69,
                                  *(undefined1 (*) [16])(uVar31 + 0x40 + lVar33));
        auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xe0 + lVar33),auVar69,
                                  *(undefined1 (*) [16])(uVar31 + 0x50 + lVar33));
        auVar60 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xf0 + lVar33),auVar69,
                                  *(undefined1 (*) [16])(uVar31 + 0x60 + lVar33));
        auVar80 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x100 + lVar33),auVar69,
                                  *(undefined1 (*) [16])(uVar31 + 0x70 + lVar33));
        auVar97 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x110 + lVar33),auVar69,
                                  *(undefined1 (*) [16])(uVar31 + 0x80 + lVar33));
        uVar1 = *(undefined4 *)(ray + k * 4);
        auVar70._4_4_ = uVar1;
        auVar70._0_4_ = uVar1;
        auVar70._8_4_ = uVar1;
        auVar70._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar100._4_4_ = uVar1;
        auVar100._0_4_ = uVar1;
        auVar100._8_4_ = uVar1;
        auVar100._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar103._4_4_ = uVar1;
        auVar103._0_4_ = uVar1;
        auVar103._8_4_ = uVar1;
        auVar103._12_4_ = uVar1;
        auVar69 = vsubps_avx(auVar73,auVar70);
        auVar88 = vsubps_avx(auVar84,auVar100);
        auVar73 = vsubps_avx(auVar59,auVar103);
        auVar84 = vsubps_avx(auVar51,auVar70);
        auVar59 = vsubps_avx(auVar75,auVar100);
        auVar51 = vsubps_avx(auVar76,auVar103);
        auVar75 = vsubps_avx(auVar60,auVar70);
        auVar76 = vsubps_avx(auVar80,auVar100);
        auVar60 = vsubps_avx(auVar97,auVar103);
        auVar80 = vsubps_avx(auVar75,auVar69);
        auVar97 = vsubps_avx(auVar76,auVar88);
        auVar70 = vsubps_avx(auVar60,auVar73);
        auVar45._0_4_ = auVar75._0_4_ + auVar69._0_4_;
        auVar45._4_4_ = auVar75._4_4_ + auVar69._4_4_;
        auVar45._8_4_ = auVar75._8_4_ + auVar69._8_4_;
        auVar45._12_4_ = auVar75._12_4_ + auVar69._12_4_;
        auVar65._0_4_ = auVar76._0_4_ + auVar88._0_4_;
        auVar65._4_4_ = auVar76._4_4_ + auVar88._4_4_;
        auVar65._8_4_ = auVar76._8_4_ + auVar88._8_4_;
        auVar65._12_4_ = auVar76._12_4_ + auVar88._12_4_;
        fVar11 = auVar73._0_4_;
        auVar71._0_4_ = auVar60._0_4_ + fVar11;
        fVar12 = auVar73._4_4_;
        auVar71._4_4_ = auVar60._4_4_ + fVar12;
        fVar13 = auVar73._8_4_;
        auVar71._8_4_ = auVar60._8_4_ + fVar13;
        fVar14 = auVar73._12_4_;
        auVar71._12_4_ = auVar60._12_4_ + fVar14;
        auVar101._0_4_ = auVar70._0_4_ * auVar65._0_4_;
        auVar101._4_4_ = auVar70._4_4_ * auVar65._4_4_;
        auVar101._8_4_ = auVar70._8_4_ * auVar65._8_4_;
        auVar101._12_4_ = auVar70._12_4_ * auVar65._12_4_;
        auVar100 = vfmsub231ps_fma(auVar101,auVar97,auVar71);
        auVar72._0_4_ = auVar71._0_4_ * auVar80._0_4_;
        auVar72._4_4_ = auVar71._4_4_ * auVar80._4_4_;
        auVar72._8_4_ = auVar71._8_4_ * auVar80._8_4_;
        auVar72._12_4_ = auVar71._12_4_ * auVar80._12_4_;
        auVar71 = vfmsub231ps_fma(auVar72,auVar70,auVar45);
        auVar46._0_4_ = auVar97._0_4_ * auVar45._0_4_;
        auVar46._4_4_ = auVar97._4_4_ * auVar45._4_4_;
        auVar46._8_4_ = auVar97._8_4_ * auVar45._8_4_;
        auVar46._12_4_ = auVar97._12_4_ * auVar45._12_4_;
        auVar45 = vfmsub231ps_fma(auVar46,auVar80,auVar65);
        fVar6 = *(float *)(ray + k * 4 + 0x60);
        auVar96._0_4_ = auVar45._0_4_ * fVar6;
        auVar96._4_4_ = auVar45._4_4_ * fVar6;
        auVar96._8_4_ = auVar45._8_4_ * fVar6;
        auVar96._12_4_ = auVar45._12_4_ * fVar6;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar99._4_4_ = uVar1;
        auVar99._0_4_ = uVar1;
        auVar99._8_4_ = uVar1;
        auVar99._12_4_ = uVar1;
        auVar71 = vfmadd231ps_fma(auVar96,auVar99,auVar71);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar104._4_4_ = uVar1;
        auVar104._0_4_ = uVar1;
        auVar104._8_4_ = uVar1;
        auVar104._12_4_ = uVar1;
        auVar65 = vfmadd231ps_fma(auVar71,auVar104,auVar100);
        auVar71 = vsubps_avx(auVar88,auVar59);
        auVar100 = vsubps_avx(auVar73,auVar51);
        auVar66._0_4_ = auVar88._0_4_ + auVar59._0_4_;
        auVar66._4_4_ = auVar88._4_4_ + auVar59._4_4_;
        auVar66._8_4_ = auVar88._8_4_ + auVar59._8_4_;
        auVar66._12_4_ = auVar88._12_4_ + auVar59._12_4_;
        auVar73._0_4_ = fVar11 + auVar51._0_4_;
        auVar73._4_4_ = fVar12 + auVar51._4_4_;
        auVar73._8_4_ = fVar13 + auVar51._8_4_;
        auVar73._12_4_ = fVar14 + auVar51._12_4_;
        fVar15 = auVar100._0_4_;
        auVar83._0_4_ = auVar66._0_4_ * fVar15;
        fVar18 = auVar100._4_4_;
        auVar83._4_4_ = auVar66._4_4_ * fVar18;
        fVar21 = auVar100._8_4_;
        auVar83._8_4_ = auVar66._8_4_ * fVar21;
        fVar24 = auVar100._12_4_;
        auVar83._12_4_ = auVar66._12_4_ * fVar24;
        auVar46 = vfmsub231ps_fma(auVar83,auVar71,auVar73);
        auVar45 = vsubps_avx(auVar69,auVar84);
        fVar16 = auVar45._0_4_;
        auVar74._0_4_ = auVar73._0_4_ * fVar16;
        fVar19 = auVar45._4_4_;
        auVar74._4_4_ = auVar73._4_4_ * fVar19;
        fVar22 = auVar45._8_4_;
        auVar74._8_4_ = auVar73._8_4_ * fVar22;
        fVar25 = auVar45._12_4_;
        auVar74._12_4_ = auVar73._12_4_ * fVar25;
        auVar92._0_4_ = auVar69._0_4_ + auVar84._0_4_;
        auVar92._4_4_ = auVar69._4_4_ + auVar84._4_4_;
        auVar92._8_4_ = auVar69._8_4_ + auVar84._8_4_;
        auVar92._12_4_ = auVar69._12_4_ + auVar84._12_4_;
        auVar73 = vfmsub231ps_fma(auVar74,auVar100,auVar92);
        fVar17 = auVar71._0_4_;
        auVar93._0_4_ = auVar92._0_4_ * fVar17;
        fVar20 = auVar71._4_4_;
        auVar93._4_4_ = auVar92._4_4_ * fVar20;
        fVar23 = auVar71._8_4_;
        auVar93._8_4_ = auVar92._8_4_ * fVar23;
        fVar26 = auVar71._12_4_;
        auVar93._12_4_ = auVar92._12_4_ * fVar26;
        auVar66 = vfmsub231ps_fma(auVar93,auVar45,auVar66);
        auVar67._0_4_ = auVar66._0_4_ * fVar6;
        auVar67._4_4_ = auVar66._4_4_ * fVar6;
        auVar67._8_4_ = auVar66._8_4_ * fVar6;
        auVar67._12_4_ = auVar66._12_4_ * fVar6;
        auVar73 = vfmadd231ps_fma(auVar67,auVar99,auVar73);
        auVar66 = vfmadd231ps_fma(auVar73,auVar104,auVar46);
        auVar46 = vsubps_avx(auVar84,auVar75);
        auVar58._0_4_ = auVar84._0_4_ + auVar75._0_4_;
        auVar58._4_4_ = auVar84._4_4_ + auVar75._4_4_;
        auVar58._8_4_ = auVar84._8_4_ + auVar75._8_4_;
        auVar58._12_4_ = auVar84._12_4_ + auVar75._12_4_;
        auVar75 = vsubps_avx(auVar59,auVar76);
        auVar50._0_4_ = auVar59._0_4_ + auVar76._0_4_;
        auVar50._4_4_ = auVar59._4_4_ + auVar76._4_4_;
        auVar50._8_4_ = auVar59._8_4_ + auVar76._8_4_;
        auVar50._12_4_ = auVar59._12_4_ + auVar76._12_4_;
        auVar76 = vsubps_avx(auVar51,auVar60);
        auVar77._0_4_ = auVar51._0_4_ + auVar60._0_4_;
        auVar77._4_4_ = auVar51._4_4_ + auVar60._4_4_;
        auVar77._8_4_ = auVar51._8_4_ + auVar60._8_4_;
        auVar77._12_4_ = auVar51._12_4_ + auVar60._12_4_;
        auVar84._0_4_ = auVar76._0_4_ * auVar50._0_4_;
        auVar84._4_4_ = auVar76._4_4_ * auVar50._4_4_;
        auVar84._8_4_ = auVar76._8_4_ * auVar50._8_4_;
        auVar84._12_4_ = auVar76._12_4_ * auVar50._12_4_;
        auVar84 = vfmsub231ps_fma(auVar84,auVar75,auVar77);
        auVar78._0_4_ = auVar77._0_4_ * auVar46._0_4_;
        auVar78._4_4_ = auVar77._4_4_ * auVar46._4_4_;
        auVar78._8_4_ = auVar77._8_4_ * auVar46._8_4_;
        auVar78._12_4_ = auVar77._12_4_ * auVar46._12_4_;
        auVar73 = vfmsub231ps_fma(auVar78,auVar76,auVar58);
        auVar59._0_4_ = auVar75._0_4_ * auVar58._0_4_;
        auVar59._4_4_ = auVar75._4_4_ * auVar58._4_4_;
        auVar59._8_4_ = auVar75._8_4_ * auVar58._8_4_;
        auVar59._12_4_ = auVar75._12_4_ * auVar58._12_4_;
        auVar59 = vfmsub231ps_fma(auVar59,auVar46,auVar50);
        auVar51._0_4_ = auVar59._0_4_ * fVar6;
        auVar51._4_4_ = auVar59._4_4_ * fVar6;
        auVar51._8_4_ = auVar59._8_4_ * fVar6;
        auVar51._12_4_ = auVar59._12_4_ * fVar6;
        auVar73 = vfmadd231ps_fma(auVar51,auVar99,auVar73);
        auVar51 = vfmadd231ps_fma(auVar73,auVar104,auVar84);
        auVar90._0_4_ = auVar51._0_4_ + auVar65._0_4_ + auVar66._0_4_;
        auVar90._4_4_ = auVar51._4_4_ + auVar65._4_4_ + auVar66._4_4_;
        auVar90._8_4_ = auVar51._8_4_ + auVar65._8_4_ + auVar66._8_4_;
        auVar90._12_4_ = auVar51._12_4_ + auVar65._12_4_ + auVar66._12_4_;
        auVar60._8_4_ = 0x7fffffff;
        auVar60._0_8_ = 0x7fffffff7fffffff;
        auVar60._12_4_ = 0x7fffffff;
        auVar73 = vminps_avx(auVar65,auVar66);
        auVar84 = vminps_avx(auVar73,auVar51);
        auVar73 = vandps_avx(auVar90,auVar60);
        auVar94._0_4_ = auVar73._0_4_ * 1.1920929e-07;
        auVar94._4_4_ = auVar73._4_4_ * 1.1920929e-07;
        auVar94._8_4_ = auVar73._8_4_ * 1.1920929e-07;
        auVar94._12_4_ = auVar73._12_4_ * 1.1920929e-07;
        uVar35 = CONCAT44(auVar94._4_4_,auVar94._0_4_);
        auVar85._0_8_ = uVar35 ^ 0x8000000080000000;
        auVar85._8_4_ = -auVar94._8_4_;
        auVar85._12_4_ = -auVar94._12_4_;
        auVar84 = vcmpps_avx(auVar84,auVar85,5);
        auVar59 = vmaxps_avx(auVar65,auVar66);
        auVar59 = vmaxps_avx(auVar59,auVar51);
        auVar59 = vcmpps_avx(auVar59,auVar94,2);
        auVar84 = vorps_avx(auVar84,auVar59);
        if ((((auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar84[0xf] < '\0') {
          auVar52._0_4_ = auVar70._0_4_ * fVar17;
          auVar52._4_4_ = auVar70._4_4_ * fVar20;
          auVar52._8_4_ = auVar70._8_4_ * fVar23;
          auVar52._12_4_ = auVar70._12_4_ * fVar26;
          auVar79._0_4_ = fVar16 * auVar97._0_4_;
          auVar79._4_4_ = fVar19 * auVar97._4_4_;
          auVar79._8_4_ = fVar22 * auVar97._8_4_;
          auVar79._12_4_ = fVar25 * auVar97._12_4_;
          auVar97 = vfmsub213ps_fma(auVar97,auVar100,auVar52);
          auVar86._0_4_ = auVar75._0_4_ * fVar15;
          auVar86._4_4_ = auVar75._4_4_ * fVar18;
          auVar86._8_4_ = auVar75._8_4_ * fVar21;
          auVar86._12_4_ = auVar75._12_4_ * fVar24;
          auVar95._0_4_ = fVar16 * auVar76._0_4_;
          auVar95._4_4_ = fVar19 * auVar76._4_4_;
          auVar95._8_4_ = fVar22 * auVar76._8_4_;
          auVar95._12_4_ = fVar25 * auVar76._12_4_;
          auVar76 = vfmsub213ps_fma(auVar76,auVar71,auVar86);
          auVar59 = vandps_avx(auVar52,auVar60);
          auVar51 = vandps_avx(auVar86,auVar60);
          auVar59 = vcmpps_avx(auVar59,auVar51,1);
          local_898 = vblendvps_avx(auVar76,auVar97,auVar59);
          auVar87._0_4_ = auVar46._0_4_ * fVar17;
          auVar87._4_4_ = auVar46._4_4_ * fVar20;
          auVar87._8_4_ = auVar46._8_4_ * fVar23;
          auVar87._12_4_ = auVar46._12_4_ * fVar26;
          auVar76 = vfmsub213ps_fma(auVar46,auVar100,auVar95);
          auVar53._0_4_ = auVar80._0_4_ * fVar15;
          auVar53._4_4_ = auVar80._4_4_ * fVar18;
          auVar53._8_4_ = auVar80._8_4_ * fVar21;
          auVar53._12_4_ = auVar80._12_4_ * fVar24;
          auVar97 = vfmsub213ps_fma(auVar70,auVar45,auVar53);
          auVar59 = vandps_avx(auVar53,auVar60);
          auVar51 = vandps_avx(auVar95,auVar60);
          auVar59 = vcmpps_avx(auVar59,auVar51,1);
          local_888 = vblendvps_avx(auVar76,auVar97,auVar59);
          auVar76 = vfmsub213ps_fma(auVar80,auVar71,auVar79);
          auVar75 = vfmsub213ps_fma(auVar75,auVar45,auVar87);
          auVar59 = vandps_avx(auVar79,auVar60);
          auVar51 = vandps_avx(auVar87,auVar60);
          auVar59 = vcmpps_avx(auVar59,auVar51,1);
          local_878 = vblendvps_avx(auVar75,auVar76,auVar59);
          auVar75._0_4_ = local_878._0_4_ * fVar6;
          auVar75._4_4_ = local_878._4_4_ * fVar6;
          auVar75._8_4_ = local_878._8_4_ * fVar6;
          auVar75._12_4_ = local_878._12_4_ * fVar6;
          auVar59 = vfmadd213ps_fma(auVar99,local_888,auVar75);
          auVar59 = vfmadd213ps_fma(auVar104,local_898,auVar59);
          auVar80._0_4_ = auVar59._0_4_ + auVar59._0_4_;
          auVar80._4_4_ = auVar59._4_4_ + auVar59._4_4_;
          auVar80._8_4_ = auVar59._8_4_ + auVar59._8_4_;
          auVar80._12_4_ = auVar59._12_4_ + auVar59._12_4_;
          auVar76._0_4_ = local_878._0_4_ * fVar11;
          auVar76._4_4_ = local_878._4_4_ * fVar12;
          auVar76._8_4_ = local_878._8_4_ * fVar13;
          auVar76._12_4_ = local_878._12_4_ * fVar14;
          auVar59 = vfmadd213ps_fma(auVar88,local_888,auVar76);
          auVar69 = vfmadd213ps_fma(auVar69,local_898,auVar59);
          auVar59 = vrcpps_avx(auVar80);
          auVar97._8_4_ = 0x3f800000;
          auVar97._0_8_ = 0x3f8000003f800000;
          auVar97._12_4_ = 0x3f800000;
          auVar88 = vfnmadd213ps_fma(auVar59,auVar80,auVar97);
          auVar59 = vfmadd132ps_fma(auVar88,auVar59,auVar59);
          local_8a8._0_4_ = auVar59._0_4_ * (auVar69._0_4_ + auVar69._0_4_);
          local_8a8._4_4_ = auVar59._4_4_ * (auVar69._4_4_ + auVar69._4_4_);
          local_8a8._8_4_ = auVar59._8_4_ * (auVar69._8_4_ + auVar69._8_4_);
          local_8a8._12_4_ = auVar59._12_4_ * (auVar69._12_4_ + auVar69._12_4_);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar88._4_4_ = uVar1;
          auVar88._0_4_ = uVar1;
          auVar88._8_4_ = uVar1;
          auVar88._12_4_ = uVar1;
          auVar59 = vcmpps_avx(auVar88,local_8a8,2);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar98._4_4_ = uVar1;
          auVar98._0_4_ = uVar1;
          auVar98._8_4_ = uVar1;
          auVar98._12_4_ = uVar1;
          auVar81 = ZEXT1664(auVar98);
          auVar69 = vcmpps_avx(local_8a8,auVar98,2);
          auVar59 = vandps_avx(auVar69,auVar59);
          auVar69 = auVar84 & auVar59;
          if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar69[0xf] < '\0') {
            auVar84 = vandps_avx(auVar84,auVar59);
            auVar59 = vcmpps_avx(auVar80,_DAT_01f7aa10,4);
            auVar84 = vandps_avx(auVar84,auVar59);
            uVar32 = vmovmskps_avx(auVar84);
            if (uVar32 != 0) {
              pSVar8 = context->scene;
              auVar84 = vrcpps_avx(auVar90);
              auVar61._8_4_ = 0x3f800000;
              auVar61._0_8_ = 0x3f8000003f800000;
              auVar61._12_4_ = 0x3f800000;
              auVar59 = vfnmadd213ps_fma(auVar90,auVar84,auVar61);
              auVar84 = vfmadd132ps_fma(auVar59,auVar84,auVar84);
              auVar54._8_4_ = 0x219392ef;
              auVar54._0_8_ = 0x219392ef219392ef;
              auVar54._12_4_ = 0x219392ef;
              auVar73 = vcmpps_avx(auVar73,auVar54,5);
              auVar73 = vandps_avx(auVar73,auVar84);
              auVar47._0_4_ = auVar65._0_4_ * auVar73._0_4_;
              auVar47._4_4_ = auVar65._4_4_ * auVar73._4_4_;
              auVar47._8_4_ = auVar65._8_4_ * auVar73._8_4_;
              auVar47._12_4_ = auVar65._12_4_ * auVar73._12_4_;
              local_8c8 = vminps_avx(auVar47,auVar61);
              auVar48._0_4_ = auVar73._0_4_ * auVar66._0_4_;
              auVar48._4_4_ = auVar73._4_4_ * auVar66._4_4_;
              auVar48._8_4_ = auVar73._8_4_ * auVar66._8_4_;
              auVar48._12_4_ = auVar73._12_4_ * auVar66._12_4_;
              local_8b8 = vminps_avx(auVar48,auVar61);
              uVar35 = (ulong)(uVar32 & 0xff);
              do {
                uVar30 = 0;
                for (uVar36 = uVar35; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000)
                {
                  uVar30 = uVar30 + 1;
                }
                uVar32 = *(uint *)(lVar33 + uVar31 + 0x120 + uVar30 * 4);
                pGVar9 = (pSVar8->geometries).items[uVar32].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005057c1:
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    return bVar42;
                  }
                  uVar36 = (ulong)(uint)((int)uVar30 * 4);
                  local_838 = *(undefined4 *)(local_8c8 + uVar36);
                  uVar1 = *(undefined4 *)(local_8b8 + uVar36);
                  local_828._4_4_ = uVar1;
                  local_828._0_4_ = uVar1;
                  local_828._8_4_ = uVar1;
                  local_828._12_4_ = uVar1;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar36);
                  args.context = context->user;
                  local_808._4_4_ = uVar32;
                  local_808._0_4_ = uVar32;
                  local_808._8_4_ = uVar32;
                  local_808._12_4_ = uVar32;
                  uVar1 = *(undefined4 *)(lVar33 + uVar31 + 0x130 + uVar36);
                  local_818._4_4_ = uVar1;
                  local_818._0_4_ = uVar1;
                  local_818._8_4_ = uVar1;
                  local_818._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_898 + uVar36);
                  uVar7 = *(undefined4 *)(local_888 + uVar36);
                  local_858._4_4_ = uVar7;
                  local_858._0_4_ = uVar7;
                  local_858._8_4_ = uVar7;
                  local_858._12_4_ = uVar7;
                  uVar7 = *(undefined4 *)(local_878 + uVar36);
                  local_848._4_4_ = uVar7;
                  local_848._0_4_ = uVar7;
                  local_848._8_4_ = uVar7;
                  local_848._12_4_ = uVar7;
                  local_868[0] = (RTCHitN)(char)uVar1;
                  local_868[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_868[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_868[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_868[4] = (RTCHitN)(char)uVar1;
                  local_868[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_868[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_868[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_868[8] = (RTCHitN)(char)uVar1;
                  local_868[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_868[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_868[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_868[0xc] = (RTCHitN)(char)uVar1;
                  local_868[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_868[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_868[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  vpcmpeqd_avx2(ZEXT1632(local_808),ZEXT1632(local_808));
                  uStack_7f4 = (args.context)->instID[0];
                  local_7f8 = uStack_7f4;
                  uStack_7f0 = uStack_7f4;
                  uStack_7ec = uStack_7f4;
                  uStack_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = uStack_7e8;
                  uStack_7e0 = uStack_7e8;
                  uStack_7dc = uStack_7e8;
                  local_a98 = *local_a78;
                  args.valid = (int *)local_a98;
                  args.geometryUserPtr = pGVar9->userPtr;
                  args.hit = local_868;
                  args.N = 4;
                  auVar73 = auVar81._0_16_;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->occlusionFilterN)(&args);
                    auVar81 = ZEXT1664(auVar73);
                  }
                  if (local_a98 == (undefined1  [16])0x0) {
                    auVar73 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar73 = auVar73 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&args);
                      auVar81 = ZEXT1664(auVar73);
                    }
                    auVar84 = vpcmpeqd_avx(local_a98,_DAT_01f7aa10);
                    auVar73 = auVar84 ^ _DAT_01f7ae20;
                    auVar62._8_4_ = 0xff800000;
                    auVar62._0_8_ = 0xff800000ff800000;
                    auVar62._12_4_ = 0xff800000;
                    auVar84 = vblendvps_avx(auVar62,*(undefined1 (*) [16])(args.ray + 0x80),auVar84)
                    ;
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar84;
                  }
                  auVar55._8_8_ = 0x100000001;
                  auVar55._0_8_ = 0x100000001;
                  if ((auVar55 & auVar73) != (undefined1  [16])0x0) goto LAB_005057c1;
                  *(int *)(ray + k * 4 + 0x80) = auVar81._0_4_;
                }
                uVar35 = uVar35 ^ 1L << (uVar30 & 0x3f);
              } while (uVar35 != 0);
            }
          }
        }
        local_a80 = local_a80 + 1;
        auVar81 = ZEXT1664(auVar44);
        auVar89 = ZEXT1664(auVar82);
        auVar91 = ZEXT1664(auVar68);
        auVar105 = ZEXT1664(auVar102);
        auVar106 = ZEXT1664(auVar64);
      } while (local_a80 != local_a70);
    }
LAB_005057ab:
    bVar42 = pNVar37 != stack;
    if (!bVar42) {
      return bVar42;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }